

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O2

void __thiscall
duckdb::BatchedDataCollection::Scan
          (BatchedDataCollection *this,BatchedChunkScanState *state,DataChunk *output)

{
  _Base_ptr p_Var1;
  pointer this_00;
  
  while( true ) {
    p_Var1 = (state->range).begin._M_node;
    if (p_Var1 == (state->range).end._M_node) {
      return;
    }
    ColumnDataCollection::Scan
              ((ColumnDataCollection *)p_Var1[1]._M_parent,&state->scan_state,output);
    if (output->count != 0) break;
    ::std::
    __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
    ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             *)&(state->range).begin._M_node[1]._M_parent,(pointer)0x0);
    ::std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                  *)state,0);
    p_Var1 = (state->range).begin._M_node;
    if (p_Var1 == (state->range).end._M_node) {
      return;
    }
    this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                            *)&p_Var1[1]._M_parent);
    ColumnDataCollection::InitializeScan(this_00,&state->scan_state,ALLOW_ZERO_COPY);
  }
  return;
}

Assistant:

void BatchedDataCollection::Scan(BatchedChunkScanState &state, DataChunk &output) {
	while (state.range.begin != state.range.end) {
		// check if there is a chunk remaining in this collection
		auto collection = state.range.begin->second.get();
		collection->Scan(state.scan_state, output);
		if (output.size() > 0) {
			return;
		}
		// there isn't! move to the next collection
		state.range.begin->second.reset();
		state.range.begin++;
		if (state.range.begin == state.range.end) {
			return;
		}
		state.range.begin->second->InitializeScan(state.scan_state);
	}
}